

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_lines.c
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  undefined4 x;
  undefined4 y;
  undefined4 uVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  ALLEGRO_EVENT_QUEUE *pAVar7;
  undefined8 uVar8;
  char *format;
  undefined8 uVar9;
  double __x;
  float fVar10;
  ALLEGRO_EVENT event;
  ALLEGRO_KEYBOARD_STATE kst;
  
  cVar4 = al_install_system(0x5020700,atexit);
  if (cVar4 == '\0') {
    format = "Could not init Allegro.\n";
  }
  else {
    al_init_primitives_addon();
    al_install_keyboard();
    al_install_mouse();
    display = (ALLEGRO_DISPLAY *)al_create_display(0x280,0x1e0);
    if (display == (ALLEGRO_DISPLAY *)0x0) {
      format = "Error creating display\n";
    }
    else {
      uVar9 = 0;
      uVar8 = al_map_rgb_f(0,0,0);
      black.b = (float)(int)uVar9;
      black.r = (float)(int)uVar8;
      black.g = (float)(int)((ulong)uVar8 >> 0x20);
      black.a = (float)((ulong)uVar9 >> 0x20);
      uVar9 = 0x3f800000;
      uVar8 = al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
      white.b = (float)(int)uVar9;
      white.r = (float)(int)uVar8;
      white.g = (float)(int)((ulong)uVar8 >> 0x20);
      white.a = (float)((ulong)uVar9 >> 0x20);
      uVar9 = 0x3f000000;
      uVar8 = al_map_rgb_f(0x3f000000,0x3f000000,0x3f19999a);
      background.b = (float)(int)uVar9;
      background.r = (float)(int)uVar8;
      background.g = (float)(int)((ulong)uVar8 >> 0x20);
      background.a = (float)((ulong)uVar9 >> 0x20);
      if (1 < argc) {
        iVar6 = strcmp(argv[1],"--memory-bitmap");
        if (iVar6 == 0) {
          al_set_new_bitmap_flags(1);
        }
      }
      dbuf = (ALLEGRO_BITMAP *)al_create_bitmap(0x280,0x1e0);
      if (dbuf != (ALLEGRO_BITMAP *)0x0) {
        al_set_target_bitmap(dbuf);
        __x = (double)background._8_8_;
        al_clear_to_color(background.r);
        draw_clip_rect();
        flip();
        pAVar7 = (ALLEGRO_EVENT_QUEUE *)al_create_event_queue();
        queue = pAVar7;
        uVar8 = al_get_keyboard_event_source();
        al_register_event_source(pAVar7,uVar8);
        pAVar7 = queue;
        uVar8 = al_get_mouse_event_source();
        al_register_event_source(pAVar7,uVar8);
        do {
          while( true ) {
            while( true ) {
              al_wait_for_event(queue,&event);
              if (event.type != 0x2e) break;
              last_y = -1;
              last_x = -1;
            }
            if (event.type == 0x15) break;
            if ((event.type == 10) && (event.display.width == 0x3b)) {
              al_destroy_event_queue(queue);
              al_destroy_bitmap(dbuf);
              return 0;
            }
          }
          al_get_keyboard_state(&kst);
          cVar4 = al_key_down(&kst,0xd7);
          cVar5 = '\x01';
          if (cVar4 == '\0') {
            cVar5 = al_key_down(&kst,0xd8);
          }
          uVar3 = event.mouse.button;
          y = event.display.height;
          x = event.display.width;
          al_set_target_bitmap(dbuf);
          fade();
          al_set_blender(0,2,0);
          draw_clip_rect();
          red_dot(x,y);
          fVar10 = (float)((ulong)__x >> 0x20);
          if (uVar3 == 1) {
            if ((last_x != -1) || (last_y != -1)) {
              my_set_clip_rect();
              if (cVar5 != '\0') {
                al_set_blender(0,2,3);
              }
              __x = (double)CONCAT44(fVar10,(float)last_y);
              al_draw_line((float)last_x,__x,(float)(int)x,(float)(int)y,white._0_8_,white._8_8_,0);
              last_y = -1;
              last_x = -1;
              goto LAB_001027fa;
            }
            last_x = x;
            last_y = y;
          }
          else {
            my_set_clip_rect();
            if (cVar5 != '\0') {
              al_set_blender(0,2,3);
            }
            for (__x = 0.0; __x < 6.283185307179586; __x = __x + 0.19634954084936207) {
              dVar1 = cos(__x);
              dVar2 = sin(__x);
              al_draw_line((float)(int)x,(float)(int)y,(float)(dVar1 * 40.0 + (double)(int)x),
                           (float)(dVar2 * 40.0 + (double)(int)y),white._0_8_,white._8_8_,0);
            }
LAB_001027fa:
            reset_clip_rect();
          }
          flip();
        } while( true );
      }
      format = "Error creating double buffer\n";
      dbuf = (ALLEGRO_BITMAP *)0x0;
    }
  }
  abort_example(format);
  iVar6 = al_draw_rectangle(0x42c90000,0x42c90000,0x4406e000,0x43bdc000,black._0_8_,black._8_8_,0);
  return iVar6;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_EVENT event;
   ALLEGRO_KEYBOARD_STATE kst;
   bool blend;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_init_primitives_addon();
   al_install_keyboard();
   al_install_mouse();

   display = al_create_display(W, H);
   if (!display) {
      abort_example("Error creating display\n");
   }

   black = al_map_rgb_f(0.0, 0.0, 0.0);
   white = al_map_rgb_f(1.0, 1.0, 1.0);
   background = al_map_rgb_f(0.5, 0.5, 0.6);

   if (argc > 1 && 0 == strcmp(argv[1], "--memory-bitmap")) {
      al_set_new_bitmap_flags(ALLEGRO_MEMORY_BITMAP);
   }
   dbuf = al_create_bitmap(W, H);
   if (!dbuf) {
      abort_example("Error creating double buffer\n");
   }

   al_set_target_bitmap(dbuf);
   al_clear_to_color(background);
   draw_clip_rect();
   flip();

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_mouse_event_source());

   while (true) {
      al_wait_for_event(queue, &event);
      if (event.type == ALLEGRO_EVENT_MOUSE_BUTTON_DOWN) {
         al_get_keyboard_state(&kst);
         blend = al_key_down(&kst, ALLEGRO_KEY_LSHIFT) ||
            al_key_down(&kst, ALLEGRO_KEY_RSHIFT);
         if (event.mouse.button == 1) {
            plonk(event.mouse.x, event.mouse.y, blend);
         } else {
            splat(event.mouse.x, event.mouse.y, blend);
         }
      }
      else if (event.type == ALLEGRO_EVENT_DISPLAY_SWITCH_OUT) {
         last_x = last_y = -1;
      }
      else if (event.type == ALLEGRO_EVENT_KEY_DOWN &&
         event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
      {
         break;
      }
   }

   al_destroy_event_queue(queue);
   al_destroy_bitmap(dbuf);

   return 0;
}